

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O3

void __thiscall
ExternalSigner::ExternalSigner
          (ExternalSigner *this,string *command,string chain,string *fingerprint,string name)

{
  long lVar1;
  pointer pcVar2;
  long *in_RCX;
  long *in_R8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_command)._M_dataplus._M_p = (pointer)&(this->m_command).field_2;
  pcVar2 = (command->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + command->_M_string_length);
  (this->m_chain)._M_dataplus._M_p = (pointer)&(this->m_chain).field_2;
  pcVar2 = (fingerprint->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_chain,pcVar2,pcVar2 + fingerprint->_M_string_length);
  (this->m_fingerprint)._M_dataplus._M_p = (pointer)&(this->m_fingerprint).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_fingerprint,*in_RCX,in_RCX[1] + *in_RCX);
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->m_name,*in_R8,in_R8[1] + *in_R8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner::ExternalSigner(const std::string& command, const std::string chain, const std::string& fingerprint, const std::string name): m_command(command), m_chain(chain), m_fingerprint(fingerprint), m_name(name) {}